

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_file_pos_after_op_with_offset(void)

{
  int iVar1;
  __off64_t _Var2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t uVar5;
  
  unlink("test_file");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(::loop,&open_req1,"test_file",0x42,0x180,0);
  if (iVar1 < 1) {
    pcVar4 = "r > 0";
    uVar3 = 0xe7d;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar1 == 0xd) {
      _Var2 = lseek64((int)open_req1.result,0,1);
      if (_Var2 == 0) {
        uv_fs_req_cleanup(&write_req);
        uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
        iov = uVar5;
        iVar1 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
        if (iVar1 == 0xd) {
          iVar1 = strcmp(buf,test_buf);
          if (iVar1 == 0) {
            _Var2 = lseek64((int)open_req1.result,0,1);
            if (_Var2 == 0) {
              uv_fs_req_cleanup(&read_req);
              iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
              if (iVar1 == 0) {
                uv_fs_req_cleanup(&close_req);
                unlink("test_file");
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar3 = uv_default_loop();
                iVar1 = uv_loop_close(uVar3);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0xe94;
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xe8e;
              }
            }
            else {
              pcVar4 = "lseek(open_req1.result, 0, SEEK_CUR) == 0";
              uVar3 = 0xe8a;
            }
          }
          else {
            pcVar4 = "strcmp(buf, test_buf) == 0";
            uVar3 = 0xe89;
          }
        }
        else {
          pcVar4 = "r == sizeof(test_buf)";
          uVar3 = 0xe88;
        }
      }
      else {
        pcVar4 = "lseek(open_req1.result, 0, SEEK_CUR) == 0";
        uVar3 = 0xe83;
      }
    }
    else {
      pcVar4 = "r == sizeof(test_buf)";
      uVar3 = 0xe82;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_file_pos_after_op_with_offset) {
  int r;

  /* Setup. */
  unlink("test_file");
  loop = uv_default_loop();

  r = uv_fs_open(loop,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r > 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}